

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O1

void __thiscall Assimp::LWO::AnimResolver::ExtractBindPose(AnimResolver *this,aiMatrix4x4 *out)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  
  if ((((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
       &((_List_node_base *)this->envelopes)->_M_next)->_M_impl)._M_node.super__List_node_base.
      _M_next == (_List_node_base *)this->envelopes) {
    out->a1 = 1.0;
    out->a2 = 0.0;
    out->a3 = 0.0;
    out->a4 = 0.0;
    out->b1 = 0.0;
    out->b2 = 1.0;
    out->b3 = 0.0;
    out->b4 = 0.0;
    out->c1 = 0.0;
    out->c2 = 0.0;
    out->c3 = 1.0;
    out->c4 = 0.0;
    out->d1 = 0.0;
    out->d2 = 0.0;
    out->d3 = 0.0;
    fVar6 = 1.0;
  }
  else {
    fVar12 = 0.0;
    fVar6 = 0.0;
    if (this->trans_x != (Envelope *)0x0) {
      fVar6 = ((this->trans_x->keys).
               super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
               super__Vector_impl_data._M_start)->value;
    }
    if (this->trans_y != (Envelope *)0x0) {
      fVar12 = ((this->trans_y->keys).
                super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                super__Vector_impl_data._M_start)->value;
    }
    fVar10 = 0.0;
    fVar15 = 0.0;
    if (this->trans_z != (Envelope *)0x0) {
      fVar15 = ((this->trans_z->keys).
                super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                super__Vector_impl_data._M_start)->value;
    }
    if (this->rotat_x != (Envelope *)0x0) {
      fVar10 = ((this->rotat_x->keys).
                super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                super__Vector_impl_data._M_start)->value;
    }
    fVar1 = 0.0;
    fVar14 = 0.0;
    if (this->rotat_y != (Envelope *)0x0) {
      fVar14 = ((this->rotat_y->keys).
                super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                super__Vector_impl_data._M_start)->value;
    }
    if (this->rotat_z != (Envelope *)0x0) {
      fVar1 = ((this->rotat_z->keys).
               super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
               super__Vector_impl_data._M_start)->value;
    }
    fVar16 = 1.0;
    if (this->scale_x != (Envelope *)0x0) {
      fVar16 = ((this->scale_x->keys).
                super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                super__Vector_impl_data._M_start)->value;
    }
    fVar7 = 1.0;
    if (this->scale_y != (Envelope *)0x0) {
      fVar7 = ((this->scale_y->keys).
               super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
               super__Vector_impl_data._M_start)->value;
    }
    fVar8 = 1.0;
    if (this->scale_z != (Envelope *)0x0) {
      fVar8 = ((this->scale_z->keys).
               super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
               super__Vector_impl_data._M_start)->value;
    }
    fVar2 = cosf(fVar1);
    fVar1 = sinf(fVar1);
    fVar3 = cosf(fVar14);
    fVar14 = sinf(fVar14);
    fVar4 = cosf(fVar10);
    fVar10 = sinf(fVar10);
    fVar20 = fVar4 * 0.0;
    fVar17 = fVar10 * -0.0 + fVar20 + 0.0;
    fVar5 = fVar10 * 0.0 + 0.0;
    fVar21 = fVar20 + fVar5;
    fVar9 = fVar6 * 0.0;
    fVar24 = fVar4 + 0.0 + fVar10 * -0.0 + fVar9;
    fVar13 = fVar10 + 0.0 + fVar20 + fVar9;
    fVar9 = fVar9 + 0.0;
    fVar25 = fVar24 * 0.0;
    fVar11 = (fVar6 + 0.0) * 0.0;
    fVar30 = fVar9 * 0.0 + fVar24 + fVar13 * 0.0 + fVar11;
    fVar34 = fVar14 * fVar13 + fVar9 * fVar3 + fVar25 + fVar11;
    fVar11 = fVar13 * fVar3 + (fVar25 - fVar9 * fVar14) + fVar11;
    fVar26 = fVar25 + fVar9 * 0.0 + fVar13 * 0.0 + fVar6 + 0.0;
    fVar9 = fVar12 * 0.0;
    fVar13 = fVar9 + fVar17;
    fVar6 = fVar9 + 1.0;
    fVar9 = fVar9 + fVar21;
    fVar25 = fVar13 * 0.0;
    fVar24 = (fVar12 + 0.0) * 0.0;
    fVar13 = fVar6 * 0.0 + fVar13 + fVar9 * 0.0 + fVar24;
    fVar19 = fVar14 * fVar9 + fVar6 * fVar3 + fVar25 + fVar24;
    fVar24 = fVar9 * fVar3 + (fVar25 - fVar6 * fVar14) + fVar24;
    fVar25 = fVar25 + fVar6 * 0.0 + fVar9 * 0.0 + fVar12 + 0.0;
    fVar9 = fVar15 * 0.0;
    fVar10 = ((fVar20 + 0.0) - fVar10) + fVar9;
    fVar6 = fVar5 + fVar4 + fVar9;
    fVar9 = fVar9 + 0.0;
    fVar4 = fVar10 * 0.0;
    fVar12 = (fVar15 + 0.0) * 0.0;
    fVar5 = fVar9 * 0.0 + fVar10 + fVar6 * 0.0 + fVar12;
    fVar18 = fVar14 * fVar6 + fVar9 * fVar3 + fVar4 + fVar12;
    fVar12 = fVar6 * fVar3 + (fVar4 - fVar9 * fVar14) + fVar12;
    fVar22 = fVar4 + fVar9 * 0.0 + fVar6 * 0.0 + fVar15 + 0.0;
    fVar17 = fVar17 + 0.0;
    fVar21 = fVar21 + 0.0;
    fVar9 = fVar17 * 0.0;
    fVar15 = fVar9 + 0.0 + fVar21 * 0.0 + 1.0;
    fVar6 = fVar30 * 0.0 + fVar34 * 0.0;
    fVar10 = fVar11 * 0.0;
    fVar35 = fVar6 + fVar10 + fVar26;
    fVar26 = fVar26 * 0.0;
    fVar20 = fVar2 * fVar30 + fVar1 * fVar34 + fVar10 + fVar26;
    fVar38 = (fVar2 * fVar34 - fVar1 * fVar30) + fVar10 + fVar26;
    fVar26 = fVar11 + fVar6 + fVar26;
    fVar10 = fVar13 * 0.0 + fVar19 * 0.0;
    fVar6 = fVar24 * 0.0;
    fVar4 = fVar10 + fVar6 + fVar25;
    fVar25 = fVar25 * 0.0;
    fVar27 = fVar2 * fVar13 + fVar1 * fVar19 + fVar6 + fVar25;
    fVar36 = (fVar2 * fVar19 - fVar1 * fVar13) + fVar6 + fVar25;
    fVar25 = fVar24 + fVar10 + fVar25;
    fVar11 = fVar5 * 0.0 + fVar18 * 0.0;
    fVar6 = fVar12 * 0.0;
    fVar19 = fVar11 + fVar6 + fVar22;
    fVar22 = fVar22 * 0.0;
    fVar31 = fVar2 * fVar5 + fVar1 * fVar18 + fVar6 + fVar22;
    fVar10 = (fVar2 * fVar18 - fVar1 * fVar5) + fVar6 + fVar22;
    fVar22 = fVar12 + fVar11 + fVar22;
    fVar5 = fVar21 * 0.0 + fVar17 + 0.0;
    fVar12 = fVar14 * fVar21 + fVar3 * 0.0 + fVar9 + 0.0;
    fVar11 = fVar5 * 0.0 + fVar12 * 0.0;
    fVar14 = fVar21 * fVar3 + fVar14 * -0.0 + fVar9 + 0.0;
    fVar6 = fVar14 * 0.0;
    fVar3 = fVar11 + fVar6 + fVar15;
    fVar15 = fVar15 * 0.0;
    fVar30 = fVar2 * fVar5 + fVar1 * fVar12 + fVar6 + fVar15;
    fVar17 = (fVar2 * fVar12 - fVar1 * fVar5) + fVar6 + fVar15;
    fVar15 = fVar14 + fVar11 + fVar15;
    fVar39 = fVar38 * 0.0;
    fVar5 = fVar20 * 0.0;
    fVar9 = fVar5 + fVar39;
    fVar1 = fVar26 * 0.0;
    fVar2 = fVar35 * 0.0;
    fVar37 = fVar36 * 0.0;
    fVar28 = fVar27 * 0.0;
    fVar29 = fVar28 + fVar37;
    fVar11 = fVar25 * 0.0;
    fVar13 = fVar4 * 0.0;
    fVar12 = fVar10 * 0.0;
    fVar32 = fVar31 * 0.0;
    fVar33 = fVar32 + fVar12;
    fVar14 = fVar22 * 0.0;
    fVar18 = fVar19 * 0.0;
    fVar24 = fVar17 * 0.0;
    fVar34 = fVar30 * 0.0;
    fVar23 = fVar34 + fVar24;
    fVar21 = fVar15 * 0.0;
    fVar6 = fVar23 + fVar21 + fVar3;
    fVar3 = fVar3 * 0.0;
    out->a1 = fVar16 * fVar20 + fVar39 + fVar1 + fVar2;
    out->a2 = fVar7 * fVar38 + fVar5 + fVar1 + fVar2;
    out->a3 = fVar8 * fVar26 + fVar9 + fVar2;
    out->a4 = fVar9 + fVar1 + fVar35;
    out->b1 = fVar16 * fVar27 + fVar37 + fVar11 + fVar13;
    out->b2 = fVar7 * fVar36 + fVar28 + fVar11 + fVar13;
    out->b3 = fVar8 * fVar25 + fVar29 + fVar13;
    out->b4 = fVar29 + fVar11 + fVar4;
    out->c1 = fVar16 * fVar31 + fVar12 + fVar14 + fVar18;
    out->c2 = fVar7 * fVar10 + fVar32 + fVar14 + fVar18;
    out->c3 = fVar8 * fVar22 + fVar33 + fVar18;
    out->c4 = fVar33 + fVar14 + fVar19;
    out->d1 = fVar16 * fVar30 + fVar24 + fVar21 + fVar3;
    out->d2 = fVar7 * fVar17 + fVar34 + fVar21 + fVar3;
    out->d3 = fVar8 * fVar15 + fVar23 + fVar3;
  }
  out->d4 = fVar6;
  return;
}

Assistant:

void AnimResolver::ExtractBindPose(aiMatrix4x4& out)
{
    // If we have no envelopes, return identity
    if (envelopes.empty()) {
        out = aiMatrix4x4();
        return;
    }
    aiVector3D angles, scaling(1.f,1.f,1.f), translation;

    if (trans_x) translation.x = trans_x->keys[0].value;
    if (trans_y) translation.y = trans_y->keys[0].value;
    if (trans_z) translation.z = trans_z->keys[0].value;

    if (rotat_x) angles.x = rotat_x->keys[0].value;
    if (rotat_y) angles.y = rotat_y->keys[0].value;
    if (rotat_z) angles.z = rotat_z->keys[0].value;

    if (scale_x) scaling.x = scale_x->keys[0].value;
    if (scale_y) scaling.y = scale_y->keys[0].value;
    if (scale_z) scaling.z = scale_z->keys[0].value;

    // build the final matrix
    aiMatrix4x4 s,rx,ry,rz,t;
    aiMatrix4x4::RotationZ(angles.z, rz);
    aiMatrix4x4::RotationX(angles.y, rx);
    aiMatrix4x4::RotationY(angles.x, ry);
    aiMatrix4x4::Translation(translation,t);
    aiMatrix4x4::Scaling(scaling,s);
    out = t*ry*rx*rz*s;
}